

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_update_consumed_size
              (nghttp2_session *session,int32_t *consumed_size_ptr,int32_t *recv_window_size_ptr,
              uint8_t window_update_queued,int32_t stream_id,size_t delta_size,int32_t param_7)

{
  int recv_window_size;
  int iVar1;
  int iVar2;
  
  if (0x7fffffff - delta_size < (ulong)(long)*consumed_size_ptr) {
    iVar1 = session_terminate_session(session,session->last_proc_stream_id,3,(char *)0x0);
    return iVar1;
  }
  iVar2 = (int)delta_size + *consumed_size_ptr;
  *consumed_size_ptr = iVar2;
  iVar1 = 0;
  if (window_update_queued == '\0') {
    recv_window_size = *recv_window_size_ptr;
    if (iVar2 < *recv_window_size_ptr) {
      recv_window_size = iVar2;
    }
    iVar2 = nghttp2_should_send_window_update(param_7,recv_window_size);
    iVar1 = 0;
    if (iVar2 != 0) {
      iVar1 = nghttp2_session_add_window_update(session,'\0',stream_id,recv_window_size);
      if (iVar1 == 0) {
        *recv_window_size_ptr = *recv_window_size_ptr - recv_window_size;
        *consumed_size_ptr = *consumed_size_ptr - recv_window_size;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int session_update_consumed_size(nghttp2_session *session,
                                        int32_t *consumed_size_ptr,
                                        int32_t *recv_window_size_ptr,
                                        uint8_t window_update_queued,
                                        int32_t stream_id, size_t delta_size,
                                        int32_t local_window_size) {
  int32_t recv_size;
  int rv;

  if ((size_t)*consumed_size_ptr > NGHTTP2_MAX_WINDOW_SIZE - delta_size) {
    return nghttp2_session_terminate_session(session,
                                             NGHTTP2_FLOW_CONTROL_ERROR);
  }

  *consumed_size_ptr += (int32_t)delta_size;

  if (window_update_queued == 0) {
    /* recv_window_size may be smaller than consumed_size, because it
       may be decreased by negative value with
       nghttp2_submit_window_update(). */
    recv_size = nghttp2_min_int32(*consumed_size_ptr, *recv_window_size_ptr);

    if (nghttp2_should_send_window_update(local_window_size, recv_size)) {
      rv = nghttp2_session_add_window_update(session, NGHTTP2_FLAG_NONE,
                                             stream_id, recv_size);

      if (rv != 0) {
        return rv;
      }

      *recv_window_size_ptr -= recv_size;
      *consumed_size_ptr -= recv_size;
    }
  }

  return 0;
}